

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * __thiscall CTcEmbedBuilderDbl::lead_node(CTcEmbedBuilderDbl *this)

{
  _func_int **pp_Var1;
  _func_int **len;
  CTcPrsNode *pCVar2;
  
  if ((G_tok->curtok_).text_len_ == 0) {
    pCVar2 = (CTcPrsNode *)0x0;
  }
  else {
    pCVar2 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x18);
    pp_Var1 = (_func_int **)(G_tok->curtok_).text_;
    len = (_func_int **)(G_tok->curtok_).text_len_;
    (pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
         (_func_int **)&PTR___cxa_pure_virtual_003160f0;
    pCVar2[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
    pCVar2[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = len;
    CTcGenTarg::note_str(G_cg,(size_t)len);
    (pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0031fdd0;
  }
  return pCVar2;
}

Assistant:

virtual CTcPrsNode *lead_node()
    {
        /* 
         *   Create a node for the initial part of the string.  This is just
         *   an ordinary double-quoted string node. If the initial part of
         *   the string is zero-length, don't create an initial node at all,
         *   since this would just generate do-nothing code.  
         */
        if (G_tok->getcur()->get_text_len() != 0)
        {
            /* create the node for the initial part of the string */
            return new CTPNDstr(G_tok->getcur()->get_text(),
                                G_tok->getcur()->get_text_len());
        }
        else
        {
            /* 
             *   the initial part of the string is empty, so we don't need a
             *   node for this portion 
             */
            return 0;
        }
    }